

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerProduct.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeInnnerProduct(ConvertLayerParameters layerParameters)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Rep *pRVar4;
  string *psVar5;
  bool bVar6;
  int iVar7;
  Type *caffeLayer;
  NeuralNetworkLayer *pNVar8;
  FlattenLayerParams *pFVar9;
  Type *pTVar10;
  BlobShape *pBVar11;
  ulong __val;
  uint64 uVar12;
  WeightParams *pWVar13;
  void **ppvVar14;
  InnerProductParameter *pIVar15;
  ulong __val_00;
  char *__assertion;
  long lVar16;
  long lVar17;
  allocator local_189;
  Type *local_188;
  Type *local_180;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Type *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  InnerProductLayerParams *local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top_flatten;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  
  iVar2 = *layerParameters.layerId;
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,iVar2);
  iVar7 = getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
  local_180 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                        (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,iVar7)
  ;
  local_188 = caffeLayer;
  if (((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar17 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_178,"Must have 1 input and 1 output",(allocator *)&local_158);
    caffeLayer = local_188;
    errorInCaffeProto(&local_178,(local_188->name_).ptr_,(local_188->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_178);
    lVar17 = (long)(caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_138 = local_180;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar4 = (caffeLayer->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar14 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar14 = (void **)0x0;
  }
  for (lVar16 = 0; lVar17 * 8 != lVar16; lVar16 = lVar16 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar14 + lVar16));
  }
  pRVar4 = (local_188->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar14 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar14 = (void **)0x0;
  }
  iVar7 = (local_188->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar17 = 0; (long)iVar7 * 8 != lVar17; lVar17 = lVar17 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar14 + lVar17));
  }
  top_flatten.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top_flatten.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top_flatten.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_130,
                 bottom.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,"_");
  std::__cxx11::to_string(&local_110,iVar2);
  std::operator+(&local_158,&local_130,&local_110);
  std::operator+(&local_178,&local_158,"_flattened");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&top_flatten,
             &local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  pNVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (layerParameters.nnWrite);
  std::operator+(&local_178,(local_188->name_).ptr_,"_preflatten");
  convertCaffeMetadata
            (&local_178,&bottom,&top_flatten,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  std::__cxx11::string::~string((string *)&local_178);
  pFVar9 = CoreML::Specification::NeuralNetworkLayer::mutable_flatten(pNVar8);
  pFVar9->mode_ = 0;
  pNVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (layerParameters.nnWrite);
  convertCaffeMetadata
            ((local_188->name_).ptr_,&top_flatten,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  local_f0 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar8);
  pIVar15 = local_188->inner_product_param_;
  if (pIVar15 == (InnerProductParameter *)0x0) {
    pIVar15 = (InnerProductParameter *)&caffe::_InnerProductParameter_default_instance_;
  }
  if ((local_138->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    std::__cxx11::string::string
              ((string *)&local_178,"Weight blobs not provided",(allocator *)&local_130);
    psVar5 = (local_188->name_).ptr_;
    std::__cxx11::string::string((string *)&local_158,"Innerproduct",(allocator *)&local_110);
    errorInCaffeProto(&local_178,psVar5,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  local_180 = (Type *)&local_180->blobs_;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      ((RepeatedPtrFieldBase *)local_180,0);
  pBVar11 = pTVar10->shape_;
  if (pBVar11 == (BlobShape *)0x0) {
    pBVar11 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar11->dim_).current_size_ == 0) {
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        ((RepeatedPtrFieldBase *)local_180,0);
    __val = (ulong)pTVar10->height_;
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        ((RepeatedPtrFieldBase *)local_180,0);
    uVar12 = (uint64)pTVar10->width_;
  }
  else {
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        ((RepeatedPtrFieldBase *)local_180,0);
    pBVar11 = pTVar10->shape_;
    if (pBVar11 == (BlobShape *)0x0) {
      pBVar11 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    __val = caffe::BlobShape::dim(pBVar11,0);
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        ((RepeatedPtrFieldBase *)local_180,0);
    pBVar11 = pTVar10->shape_;
    if (pBVar11 == (BlobShape *)0x0) {
      pBVar11 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    uVar12 = caffe::BlobShape::dim(pBVar11,1);
  }
  uVar3 = pIVar15->num_output_;
  bVar1 = pIVar15->bias_term_;
  if ((local_138->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    local_138 = (Type *)0x0;
  }
  else {
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        ((RepeatedPtrFieldBase *)local_180,1);
    local_138 = (Type *)(long)(pTVar10->data_).current_size_;
  }
  if (pIVar15->transpose_ == true) {
    std::__cxx11::string::string((string *)&local_178,"transpose",(allocator *)&local_130);
    psVar5 = (local_188->name_).ptr_;
    std::__cxx11::string::string((string *)&local_158,"Inner Product",(allocator *)&local_110);
    unsupportedCaffeParrameter(&local_178,psVar5,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  if (pIVar15->axis_ != 1) {
    std::__cxx11::string::string((string *)&local_178,"axis",(allocator *)&local_110);
    psVar5 = (local_188->name_).ptr_;
    std::__cxx11::string::string((string *)&local_158,"Inner Product",(allocator *)&local_e8);
    std::__cxx11::to_string(&local_130,pIVar15->axis_);
    unsupportedCaffeParrameterWithOption(&local_178,psVar5,&local_158,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  bVar6 = (long)local_138 < 1;
  if (bVar1 != false) {
    bVar6 = local_138 != (Type *)0x0;
  }
  if (!bVar6) {
    std::__cxx11::string::string
              ((string *)&local_178,"\'bias_term\' flag and blob size for bias incompatible",
               (allocator *)&local_130);
    psVar5 = (local_188->name_).ptr_;
    std::__cxx11::string::string((string *)&local_158,"Inner Product",(allocator *)&local_110);
    errorInCaffeProto(&local_178,psVar5,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  if ((long)__val < 0) {
    __assertion = "outputChannels >= 0";
    uVar3 = 0x5f;
  }
  else {
    if (__val != uVar3) {
      std::__cxx11::to_string(&local_e8,(ulong)uVar3);
      std::operator+(&local_110,"\'num_output\' (",&local_e8);
      std::operator+(&local_130,&local_110,
                     ") does not match the first dimension of the weight matrix (");
      std::__cxx11::to_string(&local_a8,__val);
      std::operator+(&local_158,&local_130,&local_a8);
      std::operator+(&local_178,&local_158,")");
      psVar5 = (local_188->name_).ptr_;
      std::__cxx11::string::string((string *)&local_c8,"Inner Product",&local_189);
      errorInCaffeProto(&local_178,psVar5,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    if ((long)uVar12 < 0) {
      __assertion = "inputChannels >= 0";
      uVar3 = 0x66;
    }
    else {
      local_f0->inputchannels_ = uVar12;
      local_f0->outputchannels_ = __val;
      local_f0->hasbias_ = bVar1;
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          ((RepeatedPtrFieldBase *)local_180,0);
      __val_00 = uVar12 * __val;
      iVar2 = (pTVar10->data_).current_size_;
      if (__val_00 - (long)iVar2 != 0) {
        std::__cxx11::to_string(&local_e8,__val_00);
        std::operator+(&local_110,"Expected blob size = ",&local_e8);
        std::operator+(&local_130,&local_110," but found blob of size = ");
        std::__cxx11::to_string(&local_a8,iVar2);
        std::operator+(&local_158,&local_130,&local_a8);
        std::operator+(&local_178,&local_158," in caffe");
        psVar5 = (local_188->name_).ptr_;
        std::__cxx11::string::string((string *)&local_c8,"Inner Product",&local_189);
        errorInCaffeProto(&local_178,psVar5,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      pWVar13 = CoreML::Specification::InnerProductLayerParams::mutable_weights(local_f0);
      if (__val_00 >> 0x1f == 0) {
        local_178._M_dataplus._M_p._0_4_ = 0;
        google::protobuf::RepeatedField<float>::Resize
                  (&pWVar13->floatvalue_,(int)__val_00,(float *)&local_178);
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_180,0);
        google::protobuf::RepeatedField<float>::CopyFrom(&pWVar13->floatvalue_,&pTVar10->data_);
        if (bVar1 != false) {
          if (local_138 != (Type *)__val) {
            std::__cxx11::to_string(&local_e8,__val);
            std::operator+(&local_110,"Expected blob size = ",&local_e8);
            std::operator+(&local_130,&local_110," but found blob of size = ");
            std::__cxx11::to_string(&local_a8,(long)local_138);
            std::operator+(&local_158,&local_130,&local_a8);
            std::operator+(&local_178,&local_158," in caffe");
            psVar5 = (local_188->name_).ptr_;
            std::__cxx11::string::string((string *)&local_c8,"Inner Product",&local_189);
            errorInCaffeProto(&local_178,psVar5,&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_e8);
          }
          pWVar13 = CoreML::Specification::InnerProductLayerParams::mutable_bias(local_f0);
          if (0x7fffffff < __val) {
            __assert_fail("outputChannels <= INT_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                          ,0x81,
                          "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                         );
          }
          local_178._M_dataplus._M_p._0_4_ = 0;
          google::protobuf::RepeatedField<float>::Resize
                    (&pWVar13->floatvalue_,(int)__val,(float *)&local_178);
          pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              ((RepeatedPtrFieldBase *)local_180,1);
          google::protobuf::RepeatedField<float>::CopyFrom(&pWVar13->floatvalue_,&pTVar10->data_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&top_flatten);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&top);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&bottom);
        return;
      }
      __assertion = "blobSize <= INT_MAX";
      uVar3 = 0x75;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                ,uVar3,
                "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
               );
}

Assistant:

void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    
    //We add two layers for the inner product layer: flatten + innerproduct
    std::vector<std::string> top_flatten;
    top_flatten.push_back(bottom[0] + "_" + std::to_string(layerId) + "_flattened");
    auto* nnWrite = layerParameters.nnWrite;
    
    //first write flatten
    Specification::NeuralNetworkLayer* specLayer_flatten = nnWrite->Add();
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_preflatten",
                                         bottom, top_flatten, nnWrite, mappingDataBlobNames);
    
    Specification::FlattenLayerParams* flatten_params = specLayer_flatten->mutable_flatten();
    flatten_params->set_mode(Specification::FlattenLayerParams::CHANNEL_FIRST);
    
    //now write inner product
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         top_flatten, top, nnWrite, mappingDataBlobNames);
    
    Specification::InnerProductLayerParams* specLayerParams = specLayer->mutable_innerproduct();
    const caffe::InnerProductParameter& caffeLayerParams = caffeLayer.inner_product_param();
    int64_t inputChannels = 0;
    int64_t outputChannels = 0;
    
    // First check that weights exist.
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto(
            "Weight blobs not provided", caffeLayer.name(), "Innerproduct");
    }
    
    // Sometimes caffe models do not populate the shape (infering from other parameters)
    if (caffeLayerWeights.blobs(0).shape().dim_size() == 0) {
        outputChannels = caffeLayerWeights.blobs(0).height();
        inputChannels = caffeLayerWeights.blobs(0).width();
    } else {
        outputChannels = caffeLayerWeights.blobs(0).shape().dim(0);
        inputChannels = caffeLayerWeights.blobs(0).shape().dim(1);
    }

    uint64_t numOutput = caffeLayerParams.num_output();
    bool hasBias = caffeLayerParams.bias_term();
    int64_t caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.transpose() == true) {
        CoreMLConverter::unsupportedCaffeParrameter("transpose",caffeLayer.name(), "Inner Product");
    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis", caffeLayer.name(), "Inner Product",
                                  std::to_string(caffeLayerParams.axis()));
    }
    if ( (hasBias && caffeBiasLength==0) || (!hasBias && caffeBiasLength>0)){
        CoreMLConverter::errorInCaffeProto("'bias_term' flag and blob size for bias incompatible", caffeLayer.name(), "Inner Product");
    }
    assert(outputChannels >= 0);
    if (static_cast<uint64_t>(outputChannels) != numOutput) {
        CoreMLConverter::errorInCaffeProto("'num_output' ("+std::to_string(numOutput)+") does not match the first dimension of the weight matrix ("+std::to_string(outputChannels)+")"
                                          ,caffeLayer.name(), "Inner Product");
    }
    //**************************************************************
    
    assert(inputChannels >= 0);
    specLayerParams->set_inputchannels(static_cast<uint64_t>(inputChannels));

    assert(outputChannels >= 0);
    specLayerParams->set_outputchannels(static_cast<uint64_t>(outputChannels));
    specLayerParams->set_hasbias(hasBias);
    
    // Write weights
    int64_t blobSize = inputChannels*outputChannels;
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSizeWeights != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string(caffeBlobSizeWeights)+" in caffe"
                                          , caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* weightsWrite = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weightsWrite->Resize(static_cast<int32_t>(blobSize), 0.0);
    weightsWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    
    
    // Write bias 
    if (hasBias) {
        if (caffeBiasLength != outputChannels) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                                              , caffeLayer.name(), "Inner Product");
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        biasWrite->Resize(static_cast<int32_t>(outputChannels), 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
    }

}